

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O0

int get_symbol_cost(aom_cdf_prob *cdf,int symbol)

{
  ushort uVar1;
  aom_cdf_prob p15_00;
  int iVar2;
  int in_ESI;
  long in_RDI;
  aom_cdf_prob p15;
  aom_cdf_prob prev_cdf;
  aom_cdf_prob cur_cdf;
  undefined4 local_18;
  
  uVar1 = 0x8000 - *(short *)(in_RDI + (long)in_ESI * 2);
  if (in_ESI == 0) {
    local_18 = 0;
  }
  else {
    local_18 = 0x8000 - *(ushort *)(in_RDI + (long)(in_ESI + -1) * 2);
  }
  if ((int)((uint)uVar1 - (local_18 & 0xffff)) < 5) {
    p15_00 = 0;
  }
  else {
    p15_00 = (aom_cdf_prob)((uint)uVar1 - (local_18 & 0xffff) >> 0x10);
  }
  iVar2 = av1_cost_symbol(p15_00);
  return iVar2;
}

Assistant:

static inline int get_symbol_cost(const aom_cdf_prob *cdf, int symbol) {
  const aom_cdf_prob cur_cdf = AOM_ICDF(cdf[symbol]);
  const aom_cdf_prob prev_cdf = symbol ? AOM_ICDF(cdf[symbol - 1]) : 0;
  const aom_cdf_prob p15 = AOMMAX(cur_cdf - prev_cdf, EC_MIN_PROB);

  return av1_cost_symbol(p15);
}